

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O2

void __thiscall glslang::TParseContextBase::finish(TParseContextBase *this)

{
  TString *pTVar1;
  pointer pTVar2;
  TIntermediate *this_00;
  int iVar3;
  TSymbol *pTVar4;
  undefined4 extraout_var;
  TTypeList *pTVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermAggregate *this_01;
  uint unaff_EBX;
  pointer ppTVar6;
  TString *name;
  TTypeLoc *typeLoc;
  pointer pTVar7;
  TIntermAggregate *linkage;
  pool_allocator<char> local_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  if (this->parsingBuiltins == false) {
    pTVar1 = (this->relaxedSymbols).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (name = (this->relaxedSymbols).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; name != pTVar1; name = name + 1) {
      pTVar4 = TSymbolTable::find(this->symbolTable,name,(bool *)0x0,(bool *)0x0,(int *)0x0);
      iVar3 = (*pTVar4->_vptr_TSymbol[0xd])(pTVar4);
      pTVar5 = TType::getStruct((TType *)CONCAT44(extraout_var,iVar3));
      pTVar2 = (pTVar5->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar7 = (pTVar5->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ._M_impl.super__Vector_impl_data._M_start; pTVar7 != pTVar2; pTVar7 = pTVar7 + 1
          ) {
        iVar3 = (*pTVar7->type->_vptr_TType[0x28])();
        if ((char)iVar3 != '\0') {
          unaff_EBX = unaff_EBX & 0x80000000;
          iVar3 = (*pTVar7->type->_vptr_TType[9])();
          *(uint *)CONCAT44(extraout_var_00,iVar3) = unaff_EBX;
          pTVar7->type->field_0x8 = 8;
          local_60.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_58,"/*",&local_60);
          iVar3 = (*pTVar7->type->_vptr_TType[6])();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&local_58,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_01,iVar3));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&local_58,"*/");
          (*pTVar7->type->_vptr_TType[4])(pTVar7->type,&local_58);
        }
      }
    }
    this_01 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)name);
    TIntermAggregate::TIntermAggregate(this_01);
    local_58._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this_01;
    for (ppTVar6 = (this->linkageSymbols).
                   super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                   super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 = (this->super_TParseVersions).intermediate,
        ppTVar6 !=
        (this->linkageSymbols).
        super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
        super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>._M_impl
        .super__Vector_impl_data._M_finish; ppTVar6 = ppTVar6 + 1) {
      TIntermediate::addSymbolLinkageNode(this_00,(TIntermAggregate **)&local_58,*ppTVar6);
    }
    TIntermediate::addSymbolLinkageNodes
              (this_00,(TIntermAggregate **)&local_58,(this->super_TParseVersions).language,
               this->symbolTable);
  }
  return;
}

Assistant:

void TParseContextBase::finish()
{
    if (parsingBuiltins)
        return;

    for (const TString& relaxedSymbol : relaxedSymbols)
    {
        TSymbol* symbol = symbolTable.find(relaxedSymbol);
        TType& type = symbol->getWritableType();
        for (const TTypeLoc& typeLoc : *type.getStruct())
        {
            if (typeLoc.type->isOpaque())
            {
                typeLoc.type->getSampler() = TSampler{};
                typeLoc.type->setBasicType(EbtInt);
                TString fieldName("/*");
                fieldName.append(typeLoc.type->getFieldName());
                fieldName.append("*/");
                typeLoc.type->setFieldName(fieldName);
            }
        }
    }

    // Transfer the linkage symbols to AST nodes, preserving order.
    TIntermAggregate* linkage = new TIntermAggregate;
    for (auto i = linkageSymbols.begin(); i != linkageSymbols.end(); ++i)
        intermediate.addSymbolLinkageNode(linkage, **i);
    intermediate.addSymbolLinkageNodes(linkage, getLanguage(), symbolTable);
}